

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRestruct.c
# Opt level: O2

Dec_Graph_t * Abc_NodeMffcSingleNode(Abc_ManRst_t *p,Vec_Int_t *vSims,int nNodes,Vec_Int_t *vOnes)

{
  uint uVar1;
  Dec_Node_t *pDVar2;
  uint uVar3;
  Dec_Edge_t DVar4;
  Dec_Graph_t *pGraph;
  void *pvVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  
  uVar3 = Vec_IntEntryLast(vSims);
  uVar1 = vOnes->nSize;
  uVar6 = 0;
  if (0 < (int)uVar1) {
    uVar6 = (ulong)uVar1;
  }
  lVar8 = 1;
  uVar9 = 0;
  do {
    if (uVar9 == uVar6) {
      return (Dec_Graph_t *)0x0;
    }
    lVar10 = lVar8;
    while ((int)lVar10 < (int)uVar1) {
      uVar11 = vOnes->pArray[uVar9];
      uVar7 = vOnes->pArray[lVar10];
      lVar10 = lVar10 + 1;
      if (((uVar7 | uVar11) ^ uVar3) == 0xffffffff) {
        uVar11 = uVar11 & 0x7fffffff;
        uVar7 = uVar7 & 0x7fffffff;
        pGraph = Dec_GraphCreate(2);
        pvVar5 = Vec_PtrEntry(p->vDecs,uVar11 >> 1);
        pDVar2 = pGraph->pNodes;
        (pDVar2->field_2).pFunc = pvVar5;
        pvVar5 = Vec_PtrEntry(p->vDecs,uVar7 >> 1);
        pDVar2[1].field_2.pFunc = pvVar5;
        DVar4 = Dec_GraphAddNodeAnd(pGraph,(Dec_Edge_t)(uVar11 ^ 1),(Dec_Edge_t)(uVar7 ^ 1));
        pGraph->eRoot = DVar4;
        return pGraph;
      }
    }
    lVar8 = lVar8 + 1;
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

Dec_Graph_t * Abc_NodeMffcSingleNode( Abc_ManRst_t * p, Vec_Int_t * vSims, int nNodes, Vec_Int_t * vOnes )
{
    Dec_Graph_t * pGraph;
    Dec_Edge_t eNode0, eNode1, eRoot;
    unsigned uRoot;
    int i, k;
    uRoot = (unsigned)Vec_IntEntryLast( vSims );
    for ( i = 0; i < vOnes->nSize; i++ )
        for ( k = i+1; k < vOnes->nSize; k++ )
            if ( ~uRoot == ((unsigned)vOnes->pArray[i] | (unsigned)vOnes->pArray[k]) )
            {
                eNode0 = Dec_IntToEdge( vOnes->pArray[i] ^ 1 );
                eNode1 = Dec_IntToEdge( vOnes->pArray[k] ^ 1 );
                pGraph = Dec_GraphCreate( 2 );
                Dec_GraphNode( pGraph, 0 )->pFunc = Vec_PtrEntry( p->vDecs, eNode0.Node );
                Dec_GraphNode( pGraph, 1 )->pFunc = Vec_PtrEntry( p->vDecs, eNode1.Node );
                eRoot = Dec_GraphAddNodeAnd( pGraph, eNode0, eNode1 );
                Dec_GraphSetRoot( pGraph, eRoot );
                if ( Abc_NodeCheckFull( p, pGraph ) )
                    return pGraph;
                Dec_GraphFree( pGraph );
            }
    return NULL;
}